

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O2

bool crnlib::image_utils::read_from_file(image_u8 *dest,char *pFilename,uint read_flags)

{
  bool bVar1;
  int iVar2;
  data_stream_serializer serializer;
  cfile_stream file_stream;
  
  if (read_flags < 2) {
    cfile_stream::cfile_stream(&file_stream);
    iVar2 = cfile_stream::open(&file_stream,pFilename,5,0);
    if ((char)iVar2 == '\0') {
      bVar1 = false;
    }
    else {
      serializer.m_little_endian = true;
      serializer.m_pStream = &file_stream.super_data_stream;
      bVar1 = read_from_stream(dest,&serializer,read_flags);
    }
    cfile_stream::~cfile_stream(&file_stream);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool read_from_file(image_u8& dest, const char* pFilename, uint read_flags) {
  if (read_flags > cReadFlagsAllFlags) {
    CRNLIB_ASSERT(0);
    return false;
  }

  cfile_stream file_stream;
  if (!file_stream.open(pFilename))
    return false;

  data_stream_serializer serializer(file_stream);
  return read_from_stream(dest, serializer, read_flags);
}